

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

cf_bool_t cf_str_switch_case(cf_char_t *s)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  
  if (s != (cf_char_t *)0x0) {
    cVar1 = *s;
    if (cVar1 != '\0') {
      pcVar3 = s + 1;
      do {
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          cVar2 = cVar1 + -0x20;
        }
        else {
          cVar2 = cVar1 + ' ';
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            cVar2 = cVar1;
          }
        }
        pcVar3[-1] = cVar2;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    return 1;
  }
  return 0;
}

Assistant:

cf_bool_t cf_str_switch_case(cf_char_t* s) {
    cf_char_t* p = CF_NULL_PTR;
    if (!s) return CF_FALSE;

    for (p = s; *p != '\0'; p++) {
        if (CF_IS_LOWER_ALPHA(*p)) {
            *p = CF_TO_UPPER_ALPHA(*p);
        } else {
            *p = CF_TO_LOWER_ALPHA(*p);
        }
    }
    return CF_TRUE;
}